

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O3

int __thiscall CTcSymObjBase::write_to_obj_file(CTcSymObjBase *this,CVmFile *fp)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = *(ushort *)&this->field_0xb8;
  iVar2 = 0;
  if ((char)((uVar1 & 0x10) >> 4) == '\0' && (uVar1 & 3) != 1) {
    if ((uVar1 & 0x40) == 0) {
      write_to_obj_file_main(this,fp);
      iVar2 = 1;
    }
    else if (-1 < (char)uVar1) {
      *(ushort *)&this->field_0xb8 = uVar1 | 0x80;
      return 1;
    }
  }
  return iVar2;
}

Assistant:

int CTcSymObjBase::write_to_obj_file(CVmFile *fp)
{
    /* 
     *   If the object is external and has never been referenced, don't
     *   bother writing it.
     *   
     *   In addition, if the object is marked as modified, don't write it.
     *   We write modified base objects specially, because we must control
     *   the order in which a modified base object is written relative its
     *   modifying object.  
     */
    if ((is_extern_ && !ref_) || modified_)
        return FALSE;

    /* if the object has already been written, don't write it again */
    if (written_to_obj_)
    {
        /* 
         *   if we've never been counted in the object file before, we must
         *   have been written indirectly in the course of writing another
         *   symbol - in this case, return true to indicate that we are in
         *   the file, even though we're not actually writing anything now 
         */
        if (!counted_in_obj_)
        {
            /* we've now been counted in the object file */
            counted_in_obj_ = TRUE;

            /* indicate that we have been written */
            return TRUE;
        }
        else
        {
            /* we've already been written and counted - don't write again */
            return FALSE;
        }
    }

    /* do the main part of the writing */
    return write_to_obj_file_main(fp);
}